

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  pointer peVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int in_R8D;
  long lVar10;
  extrema *e;
  pointer peVar11;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> matchKP1;
  uint cnt_match;
  uint n_pixels2;
  uint n_pixels1;
  Mat matches;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> matchKP2;
  Mat colorfulImage;
  Mat image2;
  Mat colorfulImage2;
  Mat image;
  undefined1 local_328 [24];
  undefined8 uStack_310;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_308;
  vector<extrema,_std::allocator<extrema>_> local_2e8;
  vector<extrema,_std::allocator<extrema>_> local_2c8;
  uint local_2a4;
  uint local_2a0;
  uint local_29c;
  undefined1 local_298 [12];
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  uchar *puStack_280;
  uchar *puStack_278;
  vector<double,_std::allocator<double>_> local_270;
  vector<double,_std::allocator<double>_> local_258;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_240;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  float fStack_1fc;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_1f8;
  Point_<int> local_1d8;
  _InputArray local_1d0;
  undefined1 local_1b8 [96];
  undefined1 local_158 [8];
  pointer peStack_150;
  undefined1 local_148 [88];
  undefined1 local_f0 [192];
  
  local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cv::Mat::Mat((Mat *)(local_f0 + 0x60));
  cv::Mat::Mat((Mat *)local_1b8);
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_158,"/Users/hsjimwang/Desktop/SIFT/cookbeef1.jpg","");
  cv::imread((string *)local_298,(int)local_158);
  cv::Mat::operator=((Mat *)local_1b8,(Mat *)local_298);
  cv::Mat::~Mat((Mat *)local_298);
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,local_148._0_8_ + 1);
  }
  fStack_288 = 0.0;
  uStack_284 = 0;
  local_298._0_4_ = 0x1010000;
  local_148._0_4_ = 0;
  local_148._4_4_ = 0;
  local_158._0_4_ = 0x2010000;
  peStack_150 = (pointer)(local_f0 + 0x60);
  unique0x10001235 = (pointer)local_1b8;
  cv::cvtColor((cv *)local_298,(_InputArray *)local_158,(_OutputArray *)0x6,0,in_R8D);
  rescale((Mat *)local_1b8,(Mat *)(local_f0 + 0x60));
  SIFTDescript((vector<extrema,_std::allocator<extrema>_> *)local_158,(Mat *)(local_f0 + 0x60),
               &local_29c);
  peVar11 = local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  peVar3 = local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_298._0_8_ =
       local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_148._0_8_;
  local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_158;
  local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_finish = peStack_150;
  local_298._8_4_ = SUB84(peVar3,0);
  fStack_28c = (float)((ulong)peVar3 >> 0x20);
  fStack_288 = SUB84(peVar11,0);
  uStack_284 = (undefined4)((ulong)peVar11 >> 0x20);
  local_158 = (undefined1  [8])0x0;
  peStack_150 = (pointer)0x0;
  local_148._0_4_ = 0;
  local_148._4_4_ = 0;
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)local_298);
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)local_158);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"From ",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," point, ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"we extracted ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," interest points.",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  cv::Mat::Mat((Mat *)local_158);
  cv::Mat::Mat((Mat *)local_f0);
  local_328._0_8_ = local_328 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"/Users/hsjimwang/Desktop/SIFT/cookbeef2.jpg","");
  cv::imread((string *)local_298,(int)local_328);
  cv::Mat::operator=((Mat *)local_f0,(Mat *)local_298);
  cv::Mat::~Mat((Mat *)local_298);
  if ((pointer)local_328._0_8_ != (pointer)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  fStack_288 = 0.0;
  uStack_284 = 0;
  local_298._0_4_ = 0x1010000;
  local_328._16_4_ = 0;
  local_328._20_4_ = 0;
  local_328._0_4_ = 0x2010000;
  local_328._8_8_ = (pointer)local_158;
  unique0x1000123d = (pointer)local_f0;
  cv::cvtColor((cv *)local_298,(_InputArray *)local_328,(_OutputArray *)0x6,0,in_R8D);
  rescale((Mat *)local_f0,(Mat *)local_158);
  SIFTDescript((vector<extrema,_std::allocator<extrema>_> *)local_328,(Mat *)local_158,&local_2a0);
  peVar11 = local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  peVar3 = local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_298._0_8_ =
       local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_328._16_8_;
  local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_328._0_8_;
  local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_328._8_8_;
  local_298._8_4_ = SUB84(peVar3,0);
  fStack_28c = (float)((ulong)peVar3 >> 0x20);
  fStack_288 = SUB84(peVar11,0);
  uStack_284 = (undefined4)((ulong)peVar11 >> 0x20);
  local_328._0_8_ = (pointer)0x0;
  local_328._8_8_ = (pointer)0x0;
  local_328._16_4_ = 0;
  local_328._20_4_ = 0;
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)local_298);
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"From ",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," point, ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"we extracted ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," interest points.",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  peVar3 = local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_208 = 0;
    iStack_204 = 0;
    iStack_200 = 0;
    fStack_1fc = 3.7480469;
    peVar11 = local_2e8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_298._8_4_ = peVar11->layer;
      local_298._0_8_ = peVar11->octave;
      fStack_28c = (peVar11->pt).x;
      fStack_288 = (peVar11->pt).y;
      puStack_280 = (uchar *)peVar11->angle;
      puStack_278 = (uchar *)peVar11->magnitude;
      std::vector<double,_std::allocator<double>_>::vector(&local_270,&peVar11->keypoint_bin);
      std::vector<double,_std::allocator<double>_>::vector(&local_258,&peVar11->cell_bin);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_240,&peVar11->NeighborCells);
      local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_308.
                             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x3010000);
      local_210 = (int)ROUND(fStack_28c);
      local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_f0;
      local_20c = (int)ROUND(fStack_288);
      local_328._0_8_ = CONCAT44(iStack_204,local_208);
      local_328._8_8_ = CONCAT44(fStack_1fc,iStack_200);
      local_328._16_4_ = 0;
      local_328._20_4_ = 0x406fe000;
      uStack_310 = 0;
      cv::circle(&local_308,&local_210,3,local_328,1,8,0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_240);
      if (local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      peVar11 = peVar11 + 1;
    } while (peVar11 != peVar3);
  }
  peVar3 = local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_208 = 0;
    iStack_204 = 0;
    iStack_200 = 0;
    fStack_1fc = 3.7480469;
    peVar11 = local_2c8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_328._16_4_ = 0;
      local_328._20_4_ = 0;
      local_328._0_4_ = 0x3010000;
      local_218 = (int)ROUND((peVar11->pt).x);
      local_214 = (int)ROUND((peVar11->pt).y);
      local_298._0_8_ = CONCAT44(iStack_204,local_208);
      local_298._8_4_ = iStack_200;
      fStack_28c = fStack_1fc;
      fStack_288 = 0.0;
      uStack_284 = 0x406fe000;
      puStack_280 = (uchar *)0x0;
      local_328._8_8_ = (pointer)local_1b8;
      cv::circle(local_328,&local_218,3,local_298,1,8,0);
      peVar11 = peVar11 + 1;
    } while (peVar11 != peVar3);
  }
  local_298._0_8_ = (pointer)&fStack_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"show","");
  local_328._16_4_ = 0;
  local_328._20_4_ = 0;
  local_328._0_4_ = 0x1010000;
  local_328._8_8_ = (pointer)local_1b8;
  cv::imshow((string *)local_298,(_InputArray *)local_328);
  if ((pointer)local_298._0_8_ != (pointer)&fStack_288) {
    operator_delete((void *)local_298._0_8_,CONCAT44(uStack_284,fStack_288) + 1);
  }
  cv::waitKey(0);
  local_298._0_8_ = (pointer)&fStack_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"show","");
  local_328._16_4_ = 0;
  local_328._20_4_ = 0;
  local_328._0_4_ = 0x1010000;
  local_328._8_8_ = local_f0;
  cv::imshow((string *)local_298,(_InputArray *)local_328);
  if ((pointer)local_298._0_8_ != (pointer)&fStack_288) {
    operator_delete((void *)local_298._0_8_,CONCAT44(uStack_284,fStack_288) + 1);
  }
  cv::waitKey(0);
  local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a4 = 0;
  findMatches(&local_2c8,&local_2e8,&local_308,&local_1f8,&local_2a4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"We matched ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," pairs.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  iVar2 = local_f0._8_4_;
  if ((int)local_f0._8_4_ < (int)local_1b8._8_4_) {
    iVar2 = local_1b8._8_4_;
  }
  cv::Mat::Mat((Mat *)local_298,iVar2,local_f0._12_4_ + local_1b8._12_4_,0x10);
  if (0 < (int)local_1b8._8_4_) {
    uVar6 = (ulong)(uint)local_1b8._12_4_;
    lVar5 = 0;
    do {
      if (0 < (int)uVar6) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          dVar1 = *(double *)local_1b8._72_8_;
          lVar9 = (long)*local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish * lVar5 + CONCAT44(uStack_284,fStack_288)
          ;
          *(uchar *)(lVar7 + 2 + lVar9) =
               *(uchar *)(local_1b8._16_8_ + lVar7 + 2 + (long)dVar1 * lVar5);
          *(undefined2 *)(lVar7 + lVar9) =
               *(undefined2 *)(local_1b8._16_8_ + lVar7 + (long)dVar1 * lVar5);
          lVar8 = lVar8 + 1;
          uVar6 = (ulong)(int)local_1b8._12_4_;
          lVar7 = lVar7 + 3;
        } while (lVar8 < (long)uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)local_1b8._8_4_);
  }
  if (0 < (int)local_f0._8_4_) {
    uVar6 = (ulong)(uint)local_f0._12_4_;
    lVar5 = 0;
    do {
      if (0 < (int)uVar6) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          dVar1 = *(double *)local_f0._72_8_;
          lVar10 = (long)*local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish * lVar5 +
                   CONCAT44(uStack_284,fStack_288);
          lVar9 = ((int)local_1b8._12_4_ + lVar8) * 3;
          *(uchar *)(lVar10 + 2 + lVar9) =
               *(uchar *)(local_f0._16_8_ + lVar7 + 2 + (long)dVar1 * lVar5);
          *(undefined2 *)(lVar10 + lVar9) =
               *(undefined2 *)(local_f0._16_8_ + lVar7 + (long)dVar1 * lVar5);
          lVar8 = lVar8 + 1;
          uVar6 = (ulong)(int)local_f0._12_4_;
          lVar7 = lVar7 + 3;
        } while (lVar8 < (long)uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)local_f0._8_4_);
  }
  if (local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      local_1d0.sz.width = 0;
      local_1d0.sz.height = 0;
      local_1d0.flags = 0x3010000;
      local_1d8 = local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6];
      local_220 = local_1b8._12_4_ +
                  local_1f8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6].x;
      local_21c = local_1f8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar6].y;
      local_328._0_8_ = (pointer)0x4069000000000000;
      local_328._8_8_ = (pointer)0x4069000000000000;
      local_328._16_4_ = 0;
      local_328._20_4_ = 0;
      uStack_310 = 0;
      local_1d0.obj = (Mat *)local_298;
      cv::line(&local_1d0,&local_1d8,&local_220,local_328,1,8,0);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)local_308.
                                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_308.
                                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_328._0_8_ = local_328 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"ShowMatches","");
  local_1d0.sz.width = 0;
  local_1d0.sz.height = 0;
  local_1d0.flags = 0x1010000;
  local_1d0.obj = (Mat *)local_298;
  cv::imshow((string *)local_328,&local_1d0);
  if ((pointer)local_328._0_8_ != (pointer)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  cv::waitKey(0);
  cv::Mat::~Mat((Mat *)local_298);
  if (local_1f8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_158);
  cv::Mat::~Mat((Mat *)local_1b8);
  cv::Mat::~Mat((Mat *)(local_f0 + 0x60));
  std::vector<extrema,_std::allocator<extrema>_>::~vector(&local_2e8);
  std::vector<extrema,_std::allocator<extrema>_>::~vector(&local_2c8);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
    vector<extrema> ex1, ex2;
    Mat image, colorfulImage;
    unsigned n_pixels1, n_pixels2;
    colorfulImage = imread("/Users/hsjimwang/Desktop/SIFT/cookbeef1.jpg");
    cvtColor(colorfulImage, image, COLOR_BGR2GRAY);
    rescale(colorfulImage, image);
    ex1 = SIFTDescript(image, n_pixels1);
    cout << "From " << n_pixels1 << " point, ";
    cout << "we extracted " << ex1.size() << " interest points." << endl;

    Mat image2, colorfulImage2;
    colorfulImage2 = imread("/Users/hsjimwang/Desktop/SIFT/cookbeef2.jpg");
    cvtColor(colorfulImage2, image2, COLOR_BGR2GRAY);
    rescale(colorfulImage2, image2);
    ex2 = SIFTDescript(image2, n_pixels2);
    cout << "From " << n_pixels2 << " point, ";
    cout << "we extracted " << ex2.size() << " interest points." << endl;
    for(auto e:ex2){
        circle(colorfulImage2, e.pt, 3, Scalar(0,255,255));
    }

    for(const auto& e:ex1){
        circle(colorfulImage, e.pt, 3, Scalar(0,255,255));
    }

    imshow("show", colorfulImage);
    waitKey(0);
    imshow("show", colorfulImage2);
    waitKey(0);

    vector<Point> matchKP1, matchKP2;
    unsigned cnt_match = 0;
    findMatches(ex1, ex2, matchKP1, matchKP2, cnt_match);
    cout << "We matched " << cnt_match << " pairs." << endl;

    // Show the matches
    int height = colorfulImage.rows;
    if(colorfulImage.rows < colorfulImage2.rows) height = colorfulImage2.rows;
     Mat matches(height, colorfulImage.cols + colorfulImage2.cols, CV_8UC3);
    for(int r = 0; r < colorfulImage.rows; r++){
        for(int c = 0; c < colorfulImage.cols; c++)
            matches.at<Vec3b>(r,c) = colorfulImage.at<Vec3b>(r,c);
    }
    for(int r = 0; r < colorfulImage2.rows; r++){
        for(int c = 0; c < colorfulImage2.cols; c++)
            matches.at<Vec3b>(r,c+colorfulImage.cols) = colorfulImage2.at<Vec3b>(r,c);
    }
    for(int i=0; i<matchKP1.size(); i++){
        line(matches,matchKP1[i],Point(matchKP2[i].x+colorfulImage.cols, matchKP2[i].y),Scalar(200,200,0));
    }
    imshow("ShowMatches", matches);
    waitKey(0);
    return 0;
}